

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook.c
# Opt level: O1

void duckdb_je_hook_remove(tsdn_t *tsdn,void *opaque)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  size_t buf [5];
  undefined4 local_70;
  undefined3 uStack_6c;
  undefined8 local_68 [4];
  undefined1 local_48 [4];
  undefined4 uStack_44;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  iVar2 = pthread_mutex_trylock((pthread_mutex_t *)((long)&hooks_mu.field_0 + 0x48));
  if (iVar2 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&hooks_mu);
    hooks_mu.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  hooks_mu.field_0.field_0.prof_data.n_lock_ops = hooks_mu.field_0.field_0.prof_data.n_lock_ops + 1;
  if (hooks_mu.field_0.field_0.prof_data.prev_owner != tsdn) {
    hooks_mu.field_0.witness.link.qre_prev =
         (witness_t *)(hooks_mu.field_0.field_0.prof_data.n_owner_switches + 1);
    hooks_mu.field_0.field_0.prof_data.prev_owner = tsdn;
  }
  uVar1 = *opaque;
  if ((uVar1 & 1) == 0) {
    lVar3 = 1;
    do {
      *(undefined8 *)(&local_70 + lVar3 * 2) = *(undefined8 *)((long)opaque + lVar3 * 8);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
    if (uVar1 == *opaque) {
      local_28 = local_68[2];
      uStack_20 = local_68[3];
      local_38 = local_68[0];
      uStack_30 = local_68[1];
      uStack_6c = (undefined3)((ulong)_local_48 >> 0x28);
      local_70 = stack0xffffffffffffffb9;
    }
  }
  local_68[0] = local_38;
  local_68[1] = uStack_30;
  local_68[2] = local_28;
  local_68[3] = uStack_20;
  _local_48 = CONCAT44(CONCAT31(uStack_6c,local_70._3_1_),local_70 << 8);
  lVar3 = *opaque;
  *(long *)opaque = lVar3 + 1;
  lVar4 = 1;
  do {
    *(undefined8 *)((long)opaque + lVar4 * 8) = *(undefined8 *)(&local_70 + lVar4 * 2);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  *(long *)opaque = lVar3 + 2;
  nhooks.repr = nhooks.repr - 1;
  duckdb_je_tsd_global_slow_dec(tsdn);
  hooks_mu.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&hooks_mu.field_0 + 0x48));
  return;
}

Assistant:

void
hook_remove(tsdn_t *tsdn, void *opaque) {
	if (config_debug) {
		char *hooks_begin = (char *)&hooks[0];
		char *hooks_end = (char *)&hooks[HOOK_MAX];
		char *hook = (char *)opaque;
		assert(hooks_begin <= hook && hook < hooks_end
		    && (hook - hooks_begin) % sizeof(seq_hooks_t) == 0);
	}
	malloc_mutex_lock(tsdn, &hooks_mu);
	hook_remove_locked((seq_hooks_t *)opaque);
	tsd_global_slow_dec(tsdn);
	malloc_mutex_unlock(tsdn, &hooks_mu);
}